

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O1

Matrix * __thiscall Matrix::operator+(Matrix *__return_storage_ptr__,Matrix *this,Matrix *mat)

{
  Shape *shape;
  pointer pvVar1;
  pointer pvVar2;
  pointer pvVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  
  if (((this->m_shape).field_0.m_dims[0] == (mat->m_shape).field_0.m_dims[0]) &&
     ((this->m_shape).field_0.m_dims[1] == (mat->m_shape).field_0.m_dims[1])) {
    shape = &this->m_shape;
    Matrix(__return_storage_ptr__,shape);
    if ((shape->field_0).m_dims[0] != 0) {
      pvVar1 = (this->m_vals).
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pvVar2 = (mat->m_vals).
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pvVar3 = (__return_storage_ptr__->m_vals).
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar7 = 0;
      do {
        if ((this->m_shape).field_0.m_dims[1] != 0) {
          lVar4 = *(long *)&pvVar1[uVar7].super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl;
          lVar5 = *(long *)&pvVar2[uVar7].super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl;
          lVar6 = *(long *)&pvVar3[uVar7].super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl;
          uVar8 = 0;
          do {
            *(double *)(lVar6 + uVar8 * 8) =
                 *(double *)(lVar4 + uVar8 * 8) + *(double *)(lVar5 + uVar8 * 8);
            uVar8 = uVar8 + 1;
          } while (uVar8 < (this->m_shape).field_0.m_dims[1]);
        }
        uVar7 = uVar7 + 1;
      } while (uVar7 < (shape->field_0).m_dims[0]);
    }
    return __return_storage_ptr__;
  }
  std::operator<<((ostream *)&std::cout,"ERROR [+ operator]: Shape doesn\'t match!\n");
  exit(1);
}

Assistant:

bool Shape::operator==(const Shape& shape) const{
    return (n_row==shape.n_row && n_col==shape.n_col);
}